

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O0

void BZ2_hbCreateDecodeTables
               (Int32 *limit,Int32 *base,Int32 *perm,UChar *length,Int32 minLen,Int32 maxLen,
               Int32 alphaSize)

{
  int iVar1;
  Int32 vec;
  Int32 j;
  Int32 i;
  Int32 pp;
  Int32 maxLen_local;
  Int32 minLen_local;
  UChar *length_local;
  Int32 *perm_local;
  Int32 *base_local;
  Int32 *limit_local;
  
  pp = 0;
  for (i = minLen; i <= maxLen; i = i + 1) {
    for (j = 0; j < alphaSize; j = j + 1) {
      if ((uint)length[j] == i) {
        perm[pp] = j;
        pp = pp + 1;
      }
    }
  }
  for (i = 0; i < 0x17; i = i + 1) {
    base[i] = 0;
  }
  for (i = 0; i < alphaSize; i = i + 1) {
    base[(int)(length[i] + 1)] = base[(int)(length[i] + 1)] + 1;
  }
  for (i = 1; i < 0x17; i = i + 1) {
    base[i] = base[i + -1] + base[i];
  }
  for (i = 0; i < 0x17; i = i + 1) {
    limit[i] = 0;
  }
  vec = 0;
  for (i = minLen; i <= maxLen; i = i + 1) {
    iVar1 = (base[i + 1] - base[i]) + vec;
    limit[i] = iVar1 + -1;
    vec = iVar1 * 2;
  }
  for (i = minLen + 1; i <= maxLen; i = i + 1) {
    base[i] = (limit[i + -1] + 1) * 2 - base[i];
  }
  return;
}

Assistant:

void BZ2_hbCreateDecodeTables ( Int32 *limit,
                                Int32 *base,
                                Int32 *perm,
                                UChar *length,
                                Int32 minLen,
                                Int32 maxLen,
                                Int32 alphaSize )
{
   Int32 pp, i, j, vec;

   pp = 0;
   for (i = minLen; i <= maxLen; i++)
      for (j = 0; j < alphaSize; j++)
         if (length[j] == i) { perm[pp] = j; pp++; };

   for (i = 0; i < BZ_MAX_CODE_LEN; i++) base[i] = 0;
   for (i = 0; i < alphaSize; i++) base[length[i]+1]++;

   for (i = 1; i < BZ_MAX_CODE_LEN; i++) base[i] += base[i-1];

   for (i = 0; i < BZ_MAX_CODE_LEN; i++) limit[i] = 0;
   vec = 0;

   for (i = minLen; i <= maxLen; i++) {
      vec += (base[i+1] - base[i]);
      limit[i] = vec-1;
      vec <<= 1;
   }
   for (i = minLen + 1; i <= maxLen; i++)
      base[i] = ((limit[i-1] + 1) << 1) - base[i];
}